

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.h
# Opt level: O3

int __thiscall llbuild::basic::ProcessGroup::remove(ProcessGroup *this,char *__filename)

{
  int iVar1;
  undefined1 local_14 [4];
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar1 == 0) {
    std::
    _Hashtable<int,_std::pair<const_int,_llbuild::basic::ProcessInfo>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<int,_std::pair<const_int,_llbuild::basic::ProcessInfo>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,local_14);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    iVar1 = std::condition_variable::notify_all();
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void remove(llbuild_pid_t pid) {
        {
          std::lock_guard<std::mutex> lock(mutex);
          processes.erase(pid);
        }
        processesCondition.notify_all();
      }